

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_set_length(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjVector *in_RDI;
  size_t in_stack_00000010;
  vm_obj_id_t in_stack_0000001c;
  vm_val_t nil_val;
  int32_t idx;
  int32_t new_len;
  size_t old_len;
  CVmNativeCodeDesc *in_stack_ffffffffffffff98;
  vm_val_t *in_stack_ffffffffffffffa8;
  vm_val_t local_48;
  int local_38;
  int32_t local_34;
  size_t local_30;
  vm_val_t *local_20;
  vm_obj_id_t local_14;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  if ((getp_set_length(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_set_length(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_set_length::desc,1);
    __cxa_guard_release(&getp_set_length(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffa8,(uint *)in_RDI,in_stack_ffffffffffffff98);
  if (iVar1 == 0) {
    vm_val_t::set_obj(local_20,local_14);
    local_30 = get_element_count((CVmObjVector *)0x34c719);
    local_34 = CVmBif::pop_long_val();
    if ((local_34 < 0) || (0xfffe < local_34)) {
      err_throw(0);
    }
    set_element_count_undo((CVmObjVector *)nil_val._0_8_,in_stack_0000001c,in_stack_00000010);
    vm_val_t::set_nil(&local_48);
    for (local_38 = (int)local_30; local_38 < local_34; local_38 = local_38 + 1) {
      set_element(in_RDI,(size_t)in_stack_ffffffffffffff98,(vm_val_t *)0x34c786);
    }
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_set_length(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                  uint *argc)
{
    size_t old_len;
    int32_t new_len;
    int32_t idx;
    vm_val_t nil_val;
    static CVmNativeCodeDesc desc(1);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* the return value is 'self' */
    retval->set_obj(self);

    /* note the old length */
    old_len = get_element_count();

    /* get the new length */
    new_len = CVmBif::pop_long_val(vmg0_);

    /* can't go less than zero */
    if (new_len < 0 || new_len >= VEC_MAX_ELEMENTS)
        err_throw(VMERR_BAD_VAL_BIF);

    /* set the vector to its new size */
    set_element_count_undo(vmg_ self, (size_t)new_len);

    /* 
     *   Set each newly added element to nil.  Note that we don't bother
     *   saving undo for these changes: to undo this change, the only thing
     *   we'll have to do is reduce the vector size to its previous size,
     *   and we've already saved undo for the size change.  
     */
    nil_val.set_nil();
    for (idx = old_len ; idx < new_len ; ++idx)
        set_element((size_t)idx, &nil_val);

    /* handled */
    return TRUE;
}